

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq.c
# Opt level: O2

void tester_mq_finish(_Bool unlink,mqd_t tester_mq,char *tester_mq_name,_Bool *err)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = mq_close(tester_mq);
  if ((int)CONCAT71(in_register_00000039,unlink) != 0) {
    iVar1 = mq_unlink(tester_mq_name);
  }
  if (iVar1 != -1) {
    return;
  }
  if (err != (_Bool *)0x0) {
    *err = true;
  }
  log_formatted("Fail in %s, function: %s",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                ,"tester_mq_finish");
  return;
}

Assistant:

void tester_mq_finish(bool unlink, mqd_t tester_mq, const char *tester_mq_name, bool *err) {
    assert(err != NULL);

    int tmp_err = 0;

    tmp_err = mq_close(tester_mq);
    if(unlink) {
        tmp_err = mq_unlink(tester_mq_name);
    }
    VOID_FAIL_IF(tmp_err == -1);
}